

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_scan.cpp
# Opt level: O3

wchar_t * ON_wString::ToNumber(wchar_t *buffer,double value_on_failure,double *value)

{
  uint uVar1;
  wchar_t *pwVar2;
  wchar_t wVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  double x;
  char local_buffer [512];
  undefined1 local_218 [512];
  
  if (value == (double *)0x0) {
    return (wchar_t *)0x0;
  }
  *value = value_on_failure;
  if (buffer == (wchar_t *)0x0) {
    return (wchar_t *)0x0;
  }
  wVar3 = *buffer;
  if ((wVar3 == L'-') || (wVar3 == L'+')) {
    local_218[0] = (undefined1)wVar3;
    wVar3 = buffer[1];
    buffer = buffer + 1;
    uVar5 = 1;
  }
  else {
    uVar5 = 0;
  }
  uVar1 = wVar3 + L'\xffffffc6';
  if (0xfffffff5 < uVar1) {
    do {
      if (uVar5 == 0x200) {
        return (wchar_t *)0x0;
      }
      local_218[uVar5] = (char)wVar3;
      uVar5 = uVar5 + 1;
      wVar3 = buffer[1];
      buffer = buffer + 1;
    } while ((uint)(wVar3 + L'\xffffffd0') < 10);
  }
  if (wVar3 == L'.') {
    if (0x1ff < uVar5) {
      return (wchar_t *)0x0;
    }
    local_218[uVar5] = 0x2e;
    wVar3 = buffer[1];
    if ((uint)(wVar3 + L'\xffffffd0') < 10) {
      lVar6 = -4;
      lVar7 = 0;
      do {
        if (uVar5 + lVar7 == 0x1ff) {
          return (wchar_t *)0x0;
        }
        local_218[lVar7 + uVar5 + 1] = (char)wVar3;
        wVar3 = buffer[lVar7 + 2];
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + -4;
      } while ((uint)(wVar3 + L'\xffffffd0') < 10);
      uVar5 = uVar5 + lVar7 + 1;
      buffer = (wchar_t *)((long)buffer - lVar6);
      goto LAB_005bef77;
    }
    buffer = buffer + 1;
    uVar5 = uVar5 + 1;
  }
  if (uVar1 < 0xfffffff6) {
    return (wchar_t *)0x0;
  }
LAB_005bef77:
  if ((wVar3 | 0x20U) == 0x65) {
    if (0x1ff < uVar5) {
      return (wchar_t *)0x0;
    }
    local_218[uVar5] = (char)wVar3;
    wVar3 = buffer[1];
    if ((wVar3 == L'-') || (wVar3 == L'+')) {
      if (uVar5 == 0x1ff) {
        return (wchar_t *)0x0;
      }
      local_218[uVar5 + 1] = (char)wVar3;
      uVar5 = uVar5 + 2;
      wVar3 = buffer[2];
      buffer = buffer + 2;
    }
    else {
      buffer = buffer + 1;
      uVar5 = uVar5 + 1;
    }
    while ((uint)(wVar3 + L'\xffffffd0') < 10) {
      if (0x1ff < uVar5) {
        return (wchar_t *)0x0;
      }
      local_218[uVar5] = (char)wVar3;
      uVar5 = uVar5 + 1;
      pwVar2 = buffer + 1;
      buffer = buffer + 1;
      wVar3 = *pwVar2;
    }
  }
  local_218[uVar5] = 0;
  iVar4 = __isoc99_sscanf(local_218,"%lg");
  if (iVar4 != 1) {
    buffer = (wchar_t *)0x0;
  }
  *value = value_on_failure;
  return buffer;
}

Assistant:

const wchar_t* ON_wString::ToNumber(
  const wchar_t* buffer,
  double value_on_failure,
  double* value
  )
{
  if (nullptr == value)
    return nullptr;
  *value = value_on_failure;
  if (nullptr == buffer)
    return nullptr;

  char local_buffer[512];
  const size_t local_buffer_capacity = sizeof(local_buffer) / sizeof(local_buffer[0]);
  size_t local_buffer_count = 0;

  if ('-' == *buffer || '+' == *buffer)
    local_buffer[local_buffer_count++] = (char)(*buffer++);

  bool bHaveMantissa = false;
  while (buffer[0] >= '0' && buffer[0] <= '9')
  {
    if (local_buffer_count >= local_buffer_capacity)
      return nullptr;
    local_buffer[local_buffer_count++] = (char)(*buffer++);
    bHaveMantissa = true;
  }

  if ('.' == *buffer)
  {
    if (local_buffer_count >= local_buffer_capacity)
      return nullptr;
    local_buffer[local_buffer_count++] = (char)(*buffer++);

    while (buffer[0] >= '0' && buffer[0] <= '9')
    {
      if (local_buffer_count >= local_buffer_capacity)
        return nullptr;
      local_buffer[local_buffer_count++] = (char)(*buffer++);
      bHaveMantissa = true;
    }
  }

  if (false == bHaveMantissa)
    return nullptr;

  if ('e' == *buffer || 'E' == *buffer)
  {
    if (local_buffer_count >= local_buffer_capacity)
      return nullptr;
    local_buffer[local_buffer_count++] = (char)(*buffer++);

    if ('-' == *buffer || '+' == *buffer)
    {
      if (local_buffer_count >= local_buffer_capacity)
        return nullptr;
      local_buffer[local_buffer_count++] = (char)(*buffer++);
    }

    while (buffer[0] >= '0' && buffer[0] <= '9')
    {
      if (local_buffer_count >= local_buffer_capacity)
        return nullptr;
      local_buffer[local_buffer_count++] = (char)(*buffer++);
    }
  }

  local_buffer[local_buffer_count++] = 0;

  double x = value_on_failure;
#if defined(ON_COMPILER_CLANG) || defined(ON_RUNTIME_LINUX) || defined(ON_RUNTIME_WASM)
#if defined(ON_RUNTIME_ANDROID) || defined(ON_RUNTIME_LINUX) || defined(ON_RUNTIME_WASM)
  if (1 == sscanf(local_buffer, "%lg", &x))
  {
    *value = x;
    return buffer;
  }
#else
  if (1 == sscanf_l(local_buffer, ON_Locale::InvariantCulture.NumericLocalePtr(), "%lg", &x))
  {
    *value = x;
    return buffer;
  }
#endif
#else
  if (1 == _sscanf_s_l(local_buffer, "%lg", ON_Locale::InvariantCulture.NumericLocalePtr(), &x))
  {
    *value = x;
    return buffer;
  }
#endif
  *value = value_on_failure;
  return nullptr;
}